

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O0

void FPolyObj::ClearAllSubsectorLinks(void)

{
  int local_c;
  int i;
  
  for (local_c = 0; local_c < po_NumPolyobjs; local_c = local_c + 1) {
    ClearSubsectorLinks(polyobjs + local_c);
  }
  ReleaseAllPolyNodes();
  return;
}

Assistant:

void FPolyObj::ClearAllSubsectorLinks()
{
	for (int i = 0; i < po_NumPolyobjs; i++)
	{
		polyobjs[i].ClearSubsectorLinks();
	}
	ReleaseAllPolyNodes();
}